

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printlanguage.cc
# Opt level: O3

void __thiscall PrintLanguage::pushAtom(PrintLanguage *this,Atom *atom)

{
  EmitXml *pEVar1;
  pointer pRVar2;
  int iVar3;
  ulong uVar4;
  pointer pRVar5;
  
  uVar4 = ((long)(this->nodepend).
                 super__Vector_base<PrintLanguage::NodePending,_std::allocator<PrintLanguage::NodePending>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->nodepend).
                 super__Vector_base<PrintLanguage::NodePending,_std::allocator<PrintLanguage::NodePending>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  if ((ulong)(long)this->pending <= uVar4 && uVar4 - (long)this->pending != 0) {
    recurse(this);
  }
  pRVar5 = (this->revpol).
           super__Vector_base<PrintLanguage::ReversePolish,_std::allocator<PrintLanguage::ReversePolish>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((this->revpol).
      super__Vector_base<PrintLanguage::ReversePolish,_std::allocator<PrintLanguage::ReversePolish>_>
      ._M_impl.super__Vector_impl_data._M_start != pRVar5) {
    emitOp(this,pRVar5 + -1);
    emitAtom(this,atom);
    pRVar5 = (this->revpol).
             super__Vector_base<PrintLanguage::ReversePolish,_std::allocator<PrintLanguage::ReversePolish>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    do {
      iVar3 = pRVar5[-1].visited + 1;
      pRVar5[-1].visited = iVar3;
      if (iVar3 != (pRVar5[-1].tok)->stage) {
        return;
      }
      emitOp(this,pRVar5 + -1);
      pRVar5 = (this->revpol).
               super__Vector_base<PrintLanguage::ReversePolish,_std::allocator<PrintLanguage::ReversePolish>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pEVar1 = this->emit;
      if (pRVar5[-1].paren == true) {
        (*pEVar1->_vptr_EmitXml[0x1b])(pEVar1,0x29);
      }
      else {
        (*pEVar1->_vptr_EmitXml[0x1d])(pEVar1,(ulong)(uint)pRVar5[-1].id);
      }
      pRVar2 = (this->revpol).
               super__Vector_base<PrintLanguage::ReversePolish,_std::allocator<PrintLanguage::ReversePolish>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pRVar5 = (this->revpol).
               super__Vector_base<PrintLanguage::ReversePolish,_std::allocator<PrintLanguage::ReversePolish>_>
               ._M_impl.super__Vector_impl_data._M_finish + -1;
      (this->revpol).
      super__Vector_base<PrintLanguage::ReversePolish,_std::allocator<PrintLanguage::ReversePolish>_>
      ._M_impl.super__Vector_impl_data._M_finish = pRVar5;
    } while (pRVar2 != pRVar5);
    return;
  }
  emitAtom(this,atom);
  return;
}

Assistant:

void PrintLanguage::pushAtom(const Atom &atom)

{
  if (pending < nodepend.size()) // pending varnodes before atom
    recurse();			// So we must recurse

  if (revpol.empty())
    emitAtom(atom);
  else {
    emitOp(revpol.back());
    emitAtom(atom);
    do {
      revpol.back().visited += 1;
      if (revpol.back().visited == revpol.back().tok->stage) {
	emitOp(revpol.back());
	if (revpol.back().paren)
	  emit->closeParen(')',revpol.back().id);
	else
	  emit->closeGroup(revpol.back().id);
	revpol.pop_back();
      }
      else
	break;
    } while(!revpol.empty());
  }
}